

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

cupdlp_float diffTwoNormSquared(cupdlp_float *x,cupdlp_float *y,cupdlp_int len)

{
  ulong uVar1;
  ulong uVar2;
  cupdlp_float cVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = uVar1;
  }
  cVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    cVar3 = cVar3 + (x[uVar1] - y[uVar1]) * (x[uVar1] - y[uVar1]);
  }
  return cVar3;
}

Assistant:

cupdlp_float diffTwoNormSquared(cupdlp_float *x, cupdlp_float *y,
                                const cupdlp_int len) {
  cupdlp_float res = 0.0;
  for (int i = 0; i < len; i++) {
    cupdlp_float tmp = x[i] - y[i];
    res += tmp * tmp;
  }
  return res;
}